

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O0

void __thiscall
SimpleLineFunctorNumericalDiff::~SimpleLineFunctorNumericalDiff
          (SimpleLineFunctorNumericalDiff *this)

{
  SimpleLineFunctorNumericalDiff *this_local;
  
  Eigen::NumericalDiff<SimpleLineFunctor,_(Eigen::NumericalDiffMode)0>::~NumericalDiff
            (&this->super_NumericalDiff<SimpleLineFunctor,_(Eigen::NumericalDiffMode)0>);
  return;
}

Assistant:

Point2DVector GeneratePoints(const unsigned int numberOfPoints)
{
    Point2DVector points;
    // Model y = 2*x + 5 with some noise (meaning that the resulting minimization should be about (2,5)
    for(unsigned int i = 0; i < numberOfPoints; ++i)
    {
        double x = static_cast<double>(i);
        Eigen::Vector2d point;
        point(0) = x;
        point(1) = 2.0 * x + 5.0 + drand48()/10.0;
        points.push_back(point);
    }

  return points;
}